

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O1

Cdr * __thiscall eprosima::fastcdr::Cdr::deserializeArray(Cdr *this,bool *bool_t,size_t numElements)

{
  byte *pbVar1;
  NotEnoughMemoryException *this_00;
  size_t sVar2;
  bool bVar3;
  
  if (numElements <=
      (ulong)((long)(this->m_lastPosition).m_currentPosition -
             (long)(this->m_currentPosition).m_currentPosition)) {
    this->m_lastDataSize = 1;
    if (numElements != 0) {
      sVar2 = 1;
      pbVar1 = (byte *)(this->m_currentPosition).m_currentPosition;
      do {
        (this->m_currentPosition).m_currentPosition = (char *)(pbVar1 + 1);
        if (*pbVar1 < 2) {
          bool_t[sVar2 - 1] = (bool)*pbVar1;
        }
        bVar3 = sVar2 != numElements;
        sVar2 = sVar2 + 1;
        pbVar1 = pbVar1 + 1;
      } while (bVar3);
    }
    return this;
  }
  this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
  exception::NotEnoughMemoryException::NotEnoughMemoryException
            (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
  __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
              exception::NotEnoughMemoryException::~NotEnoughMemoryException);
}

Assistant:

Cdr::DDSCdrPlFlag Cdr::getDDSCdrPlFlag() const
{
    return m_plFlag;
}